

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNSparseMatrix_Realloc(SUNMatrix A)

{
  long lVar1;
  void *pvVar2;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  sunindextype nzmax;
  
  lVar1 = *(long *)(*(long *)(*in_RDI + 0x38) + *(long *)(*in_RDI + 0x18) * 8);
  pvVar2 = realloc(*(void **)(*in_RDI + 0x30),lVar1 << 3);
  *(void **)(*in_RDI + 0x30) = pvVar2;
  pvVar2 = realloc(*(void **)(*in_RDI + 0x20),lVar1 << 3);
  *(void **)(*in_RDI + 0x20) = pvVar2;
  *(long *)(*in_RDI + 0x10) = lVar1;
  return 0;
}

Assistant:

SUNErrCode SUNSparseMatrix_Realloc(SUNMatrix A)
{
  sunindextype nzmax;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);

  /* get total number of nonzeros (return with failure if illegal) */
  nzmax = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];
  SUNAssert(nzmax >= 0, SUN_ERR_ARG_CORRUPT);

  /* perform reallocation */
  SM_INDEXVALS_S(A) = (sunindextype*)realloc(SM_INDEXVALS_S(A),
                                             nzmax * sizeof(sunindextype));
  SUNAssert(SM_INDEXVALS_S(A), SUN_ERR_MALLOC_FAIL);

  SM_DATA_S(A) = (sunrealtype*)realloc(SM_DATA_S(A), nzmax * sizeof(sunrealtype));
  SUNAssert(SM_DATA_S(A), SUN_ERR_MALLOC_FAIL);

  SM_NNZ_S(A) = nzmax;

  return SUN_SUCCESS;
}